

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CheckerMemberVisitor::handle
          (CheckerMemberVisitor *this,HierarchicalValueExpression *expr)

{
  ValueSymbol *symbol;
  Scope *pSVar1;
  bool bVar2;
  ValueSymbol *pVVar3;
  Diagnostic *this_00;
  
  symbol = (expr->super_ValueExpressionBase).symbol;
  pVVar3 = symbol;
  while( true ) {
    pSVar1 = (pVVar3->super_Symbol).parentScope;
    if (pSVar1 == (Scope *)0x0) {
      return;
    }
    pVVar3 = (ValueSymbol *)pSVar1->thisSym;
    if ((pVVar3->super_Symbol).kind != StatementBlock) break;
    if ((pVVar3->declaredType).flags.m_bits != 0) {
      bVar2 = isFromChecker(this,&symbol->super_Symbol);
      if (bVar2) {
        return;
      }
      this_00 = Scope::addDiag(&this->body->super_Scope,(DiagCode)0x3b0007,
                               (expr->super_ValueExpressionBase).super_Expression.sourceRange);
      Diagnostic::addNote(this_00,(DiagCode)0x50001,
                          (((expr->super_ValueExpressionBase).symbol)->super_Symbol).location);
      return;
    }
  }
  return;
}

Assistant:

void handle(const HierarchicalValueExpression& expr) {
        bool inForkJoin = false;
        auto scope = expr.symbol.getParentScope();
        while (scope) {
            auto& sym = scope->asSymbol();
            if (sym.kind != SymbolKind::StatementBlock)
                break;

            if (sym.as<StatementBlockSymbol>().blockKind != StatementBlockKind::Sequential) {
                inForkJoin = true;
                break;
            }

            scope = sym.getParentScope();
        }

        if (inForkJoin && !isFromChecker(expr.symbol)) {
            auto& diag = body.addDiag(diag::CheckerForkJoinRef, expr.sourceRange);
            diag.addNote(diag::NoteDeclarationHere, expr.symbol.location);
            return;
        }

        visitDefault(expr);
    }